

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  ushort uVar12;
  ushort uVar13;
  size_t sVar14;
  Geometry *pGVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  byte bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined4 uVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  RTCRayN *pRVar40;
  long lVar41;
  byte bVar42;
  undefined4 uVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  RTCIntersectArguments *pRVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  size_t sVar51;
  ulong uVar52;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar53;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  ulong uVar61;
  float fVar62;
  uint uVar63;
  float fVar64;
  float fVar83;
  float fVar86;
  vint4 ai;
  uint uVar84;
  uint uVar87;
  float fVar90;
  uint uVar91;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar92;
  float fVar93;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar77;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar80;
  undefined1 auVar81 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar82;
  byte bVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  byte bVar113;
  byte bVar114;
  byte bVar116;
  float fVar117;
  byte bVar121;
  byte bVar122;
  float fVar123;
  vint4 ai_1;
  uint uVar96;
  uint uVar118;
  uint uVar124;
  float fVar126;
  uint uVar127;
  StackItemT<embree::NodeRefPtr<4>_> SVar99;
  byte bVar115;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar119;
  float fVar120;
  float fVar125;
  float fVar128;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar129;
  float fVar130;
  float fVar137;
  float fVar138;
  vint4 ai_2;
  StackItemT<embree::NodeRefPtr<4>_> SVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar141;
  float fVar151;
  float fVar154;
  vint4 ai_3;
  uint uVar142;
  float fVar143;
  uint uVar152;
  uint uVar155;
  float fVar157;
  uint uVar158;
  undefined1 auVar144 [16];
  float fVar153;
  float fVar156;
  float fVar159;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar160;
  float fVar169;
  float fVar170;
  vint4 bi_3;
  undefined1 auVar161 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar171;
  undefined1 auVar165 [16];
  float fVar172;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar173;
  float fVar178;
  float fVar179;
  vint4 bi_5;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar180;
  undefined1 auVar177 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar181 [16];
  float fVar184;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar192 [16];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fStack_1360;
  float fStack_135c;
  vbool<4> valid;
  undefined8 local_1348;
  undefined8 uStack_1340;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1268 [4];
  float local_1258 [4];
  undefined1 local_1248 [16];
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  vint4 bi_1;
  ulong local_10f0;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint local_fc8;
  uint uStack_fc4;
  uint uStack_fc0;
  uint uStack_fbc;
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar54 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_11e8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1208 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar61 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar49 = uVar57 ^ 0x10;
  iVar9 = (tray->tnear).field_0.i[k];
  bi_1.field_0.i[0] = *(int *)((long)&(tray->tfar).field_0 + k * 4);
  bi_1.field_0.i[1] = bi_1.field_0.i[0];
  bi_1.field_0.i[2] = bi_1.field_0.i[0];
  bi_1.field_0.i[3] = bi_1.field_0.i[0];
  lVar38 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_11e4 = local_11e8;
  fStack_11e0 = local_11e8;
  fStack_11dc = local_11e8;
  fStack_1204 = local_1208;
  fStack_1200 = local_1208;
  fStack_11fc = local_1208;
  fVar92 = local_1208;
  fVar139 = local_1208;
  fVar129 = local_1208;
  fVar171 = local_1208;
  fVar85 = local_11e8;
  fVar64 = local_11e8;
  fVar97 = local_11e8;
  fVar119 = local_11e8;
  while (pSVar54 != stack) {
    pSVar53 = pSVar54 + -1;
    pSVar54 = pSVar54 + -1;
    if ((float)pSVar53->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar53->dist == *(float *)(ray + k * 4 + 0x80)) {
      sVar51 = (pSVar54->ptr).ptr;
      pSVar53 = pSVar54;
      do {
        if ((sVar51 & 8) == 0) {
          pfVar4 = (float *)(sVar51 + 0x20 + uVar56);
          fVar62 = (*pfVar4 - fVar85) * fVar6;
          fVar83 = (pfVar4[1] - fVar64) * fVar6;
          fVar86 = (pfVar4[2] - fVar97) * fVar6;
          fVar90 = (pfVar4[3] - fVar119) * fVar6;
          pfVar4 = (float *)(sVar51 + 0x20 + uVar61);
          fVar95 = (*pfVar4 - fVar92) * fVar7;
          fVar117 = (pfVar4[1] - fVar139) * fVar7;
          fVar123 = (pfVar4[2] - fVar129) * fVar7;
          fVar126 = (pfVar4[3] - fVar171) * fVar7;
          uVar96 = (uint)((int)fVar95 < (int)fVar62) * (int)fVar62 |
                   (uint)((int)fVar95 >= (int)fVar62) * (int)fVar95;
          uVar118 = (uint)((int)fVar117 < (int)fVar83) * (int)fVar83 |
                    (uint)((int)fVar117 >= (int)fVar83) * (int)fVar117;
          uVar124 = (uint)((int)fVar123 < (int)fVar86) * (int)fVar86 |
                    (uint)((int)fVar123 >= (int)fVar86) * (int)fVar123;
          uVar127 = (uint)((int)fVar126 < (int)fVar90) * (int)fVar90 |
                    (uint)((int)fVar126 >= (int)fVar90) * (int)fVar126;
          pfVar4 = (float *)(sVar51 + 0x20 + uVar57);
          fVar62 = (*pfVar4 - fVar5) * fVar8;
          fVar83 = (pfVar4[1] - fVar5) * fVar8;
          fVar86 = (pfVar4[2] - fVar5) * fVar8;
          fVar90 = (pfVar4[3] - fVar5) * fVar8;
          pfVar4 = (float *)(sVar51 + 0x20 + (uVar56 ^ 0x10));
          fVar95 = (*pfVar4 - fVar85) * fVar6;
          fVar117 = (pfVar4[1] - fVar64) * fVar6;
          fVar123 = (pfVar4[2] - fVar97) * fVar6;
          fVar126 = (pfVar4[3] - fVar119) * fVar6;
          pfVar4 = (float *)(sVar51 + 0x20 + (uVar61 ^ 0x10));
          fVar141 = (*pfVar4 - fVar92) * fVar7;
          fVar151 = (pfVar4[1] - fVar139) * fVar7;
          fVar154 = (pfVar4[2] - fVar129) * fVar7;
          fVar157 = (pfVar4[3] - fVar171) * fVar7;
          uVar142 = (uint)((int)fVar95 < (int)fVar141) * (int)fVar95 |
                    (uint)((int)fVar95 >= (int)fVar141) * (int)fVar141;
          uVar152 = (uint)((int)fVar117 < (int)fVar151) * (int)fVar117 |
                    (uint)((int)fVar117 >= (int)fVar151) * (int)fVar151;
          uVar155 = (uint)((int)fVar123 < (int)fVar154) * (int)fVar123 |
                    (uint)((int)fVar123 >= (int)fVar154) * (int)fVar154;
          uVar158 = (uint)((int)fVar126 < (int)fVar157) * (int)fVar126 |
                    (uint)((int)fVar126 >= (int)fVar157) * (int)fVar157;
          pfVar4 = (float *)(sVar51 + 0x20 + uVar49);
          fVar95 = (*pfVar4 - fVar5) * fVar8;
          fVar117 = (pfVar4[1] - fVar5) * fVar8;
          fVar123 = (pfVar4[2] - fVar5) * fVar8;
          fVar126 = (pfVar4[3] - fVar5) * fVar8;
          uVar63 = (uint)((int)fVar62 < iVar9) * iVar9 | (uint)((int)fVar62 >= iVar9) * (int)fVar62;
          uVar84 = (uint)((int)fVar83 < iVar9) * iVar9 | (uint)((int)fVar83 >= iVar9) * (int)fVar83;
          uVar87 = (uint)((int)fVar86 < iVar9) * iVar9 | (uint)((int)fVar86 >= iVar9) * (int)fVar86;
          uVar91 = (uint)((int)fVar90 < iVar9) * iVar9 | (uint)((int)fVar90 >= iVar9) * (int)fVar90;
          tNear.field_0.i[0] =
               ((int)uVar63 < (int)uVar96) * uVar96 | ((int)uVar63 >= (int)uVar96) * uVar63;
          tNear.field_0.i[1] =
               ((int)uVar84 < (int)uVar118) * uVar118 | ((int)uVar84 >= (int)uVar118) * uVar84;
          tNear.field_0.i[2] =
               ((int)uVar87 < (int)uVar124) * uVar124 | ((int)uVar87 >= (int)uVar124) * uVar87;
          tNear.field_0.i[3] =
               ((int)uVar91 < (int)uVar127) * uVar127 | ((int)uVar91 >= (int)uVar127) * uVar91;
          uVar63 = (uint)(bi_1.field_0.i[0] < (int)fVar95) * bi_1.field_0.i[0] |
                   (uint)(bi_1.field_0.i[0] >= (int)fVar95) * (int)fVar95;
          uVar84 = (uint)(bi_1.field_0.i[1] < (int)fVar117) * bi_1.field_0.i[1] |
                   (uint)(bi_1.field_0.i[1] >= (int)fVar117) * (int)fVar117;
          uVar87 = (uint)(bi_1.field_0.i[2] < (int)fVar123) * bi_1.field_0.i[2] |
                   (uint)(bi_1.field_0.i[2] >= (int)fVar123) * (int)fVar123;
          uVar91 = (uint)(bi_1.field_0.i[3] < (int)fVar126) * bi_1.field_0.i[3] |
                   (uint)(bi_1.field_0.i[3] >= (int)fVar126) * (int)fVar126;
          auVar72._0_4_ =
               -(uint)((int)(((int)uVar142 < (int)uVar63) * uVar142 |
                            ((int)uVar142 >= (int)uVar63) * uVar63) < tNear.field_0.i[0]);
          auVar72._4_4_ =
               -(uint)((int)(((int)uVar152 < (int)uVar84) * uVar152 |
                            ((int)uVar152 >= (int)uVar84) * uVar84) < tNear.field_0.i[1]);
          auVar72._8_4_ =
               -(uint)((int)(((int)uVar155 < (int)uVar87) * uVar155 |
                            ((int)uVar155 >= (int)uVar87) * uVar87) < tNear.field_0.i[2]);
          auVar72._12_4_ =
               -(uint)((int)(((int)uVar158 < (int)uVar91) * uVar158 |
                            ((int)uVar158 >= (int)uVar91) * uVar91) < tNear.field_0.i[3]);
          uVar36 = movmskps((int)uVar49,auVar72);
          local_10f0 = (ulong)(byte)((byte)uVar36 ^ 0xf);
        }
        pSVar54 = pSVar53;
        if ((sVar51 & 8) == 0) {
          if (local_10f0 == 0) {
            iVar37 = 4;
          }
          else {
            uVar50 = sVar51 & 0xfffffffffffffff0;
            lVar41 = 0;
            if (local_10f0 != 0) {
              for (; (local_10f0 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            iVar37 = 0;
            sVar51 = *(size_t *)(uVar50 + lVar41 * 8);
            uVar52 = local_10f0 - 1 & local_10f0;
            if (uVar52 != 0) {
              uVar63 = tNear.field_0.i[lVar41];
              lVar41 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              sVar14 = *(size_t *)(uVar50 + lVar41 * 8);
              uVar84 = tNear.field_0.i[lVar41];
              uVar52 = uVar52 - 1 & uVar52;
              if (uVar52 == 0) {
                pSVar54 = pSVar53 + 1;
                if (uVar63 < uVar84) {
                  (pSVar53->ptr).ptr = sVar14;
                  pSVar53->dist = uVar84;
                }
                else {
                  (pSVar53->ptr).ptr = sVar51;
                  pSVar53->dist = uVar63;
                  sVar51 = sVar14;
                }
              }
              else {
                auVar76._8_4_ = uVar63;
                auVar76._0_8_ = sVar51;
                auVar76._12_4_ = 0;
                auVar102._8_4_ = uVar84;
                auVar102._0_8_ = sVar14;
                auVar102._12_4_ = 0;
                lVar41 = 0;
                if (uVar52 != 0) {
                  for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                uVar11 = *(undefined8 *)(uVar50 + lVar41 * 8);
                iVar44 = tNear.field_0.i[lVar41];
                auVar164._8_4_ = iVar44;
                auVar164._0_8_ = uVar11;
                auVar164._12_4_ = 0;
                auVar134._8_4_ = -(uint)((int)uVar63 < (int)uVar84);
                uVar52 = uVar52 - 1 & uVar52;
                fVar92 = local_1208;
                fVar139 = fStack_1204;
                fVar129 = fStack_1200;
                fVar171 = fStack_11fc;
                if (uVar52 == 0) {
                  auVar134._4_4_ = auVar134._8_4_;
                  auVar134._0_4_ = auVar134._8_4_;
                  auVar134._12_4_ = auVar134._8_4_;
                  auVar144._8_4_ = uVar84;
                  auVar144._0_8_ = sVar14;
                  auVar144._12_4_ = 0;
                  auVar176 = blendvps(auVar144,auVar76,auVar134);
                  auVar72 = blendvps(auVar76,auVar102,auVar134);
                  auVar65._8_4_ = -(uint)(auVar176._8_4_ < iVar44);
                  auVar65._4_4_ = auVar65._8_4_;
                  auVar65._0_4_ = auVar65._8_4_;
                  auVar65._12_4_ = auVar65._8_4_;
                  auVar161._8_4_ = iVar44;
                  auVar161._0_8_ = uVar11;
                  auVar161._12_4_ = 0;
                  auVar102 = blendvps(auVar161,auVar176,auVar65);
                  auVar76 = blendvps(auVar176,auVar164,auVar65);
                  auVar66._8_4_ = -(uint)(auVar72._8_4_ < auVar76._8_4_);
                  auVar66._4_4_ = auVar66._8_4_;
                  auVar66._0_4_ = auVar66._8_4_;
                  auVar66._12_4_ = auVar66._8_4_;
                  SVar131 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar76,auVar72,auVar66);
                  SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar72,auVar76,auVar66);
                  *pSVar53 = SVar99;
                  pSVar53[1] = SVar131;
                  sVar51 = auVar102._0_8_;
                  pSVar54 = pSVar53 + 2;
                }
                else {
                  lVar41 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                  auVar176._4_4_ = auVar134._8_4_;
                  auVar176._0_4_ = auVar134._8_4_;
                  auVar176._8_4_ = auVar134._8_4_;
                  auVar176._12_4_ = auVar134._8_4_;
                  auVar134 = blendvps(auVar102,auVar76,auVar176);
                  auVar72 = blendvps(auVar76,auVar102,auVar176);
                  auVar174._8_4_ = tNear.field_0.i[lVar41];
                  auVar174._0_8_ = *(undefined8 *)(uVar50 + lVar41 * 8);
                  auVar174._12_4_ = 0;
                  auVar67._8_4_ = -(uint)(iVar44 < tNear.field_0.i[lVar41]);
                  auVar67._4_4_ = auVar67._8_4_;
                  auVar67._0_4_ = auVar67._8_4_;
                  auVar67._12_4_ = auVar67._8_4_;
                  auVar102 = blendvps(auVar174,auVar164,auVar67);
                  auVar76 = blendvps(auVar164,auVar174,auVar67);
                  auVar68._8_4_ = -(uint)(auVar72._8_4_ < auVar76._8_4_);
                  auVar68._4_4_ = auVar68._8_4_;
                  auVar68._0_4_ = auVar68._8_4_;
                  auVar68._12_4_ = auVar68._8_4_;
                  auVar164 = blendvps(auVar76,auVar72,auVar68);
                  SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar72,auVar76,auVar68);
                  auVar69._8_4_ = -(uint)(auVar134._8_4_ < auVar102._8_4_);
                  auVar69._4_4_ = auVar69._8_4_;
                  auVar69._0_4_ = auVar69._8_4_;
                  auVar69._12_4_ = auVar69._8_4_;
                  auVar72 = blendvps(auVar102,auVar134,auVar69);
                  auVar76 = blendvps(auVar134,auVar102,auVar69);
                  auVar70._8_4_ = -(uint)(auVar76._8_4_ < auVar164._8_4_);
                  auVar70._4_4_ = auVar70._8_4_;
                  auVar70._0_4_ = auVar70._8_4_;
                  auVar70._12_4_ = auVar70._8_4_;
                  SVar162 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar164,auVar76,auVar70);
                  SVar131 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar76,auVar164,auVar70);
                  *pSVar53 = SVar99;
                  pSVar53[1] = SVar131;
                  pSVar53[2] = SVar162;
                  sVar51 = auVar72._0_8_;
                  pSVar54 = pSVar53 + 3;
                  fVar85 = local_11e8;
                  fVar64 = fStack_11e4;
                  fVar97 = fStack_11e0;
                  fVar119 = fStack_11dc;
                }
              }
            }
          }
        }
        else {
          iVar37 = 6;
        }
        pSVar53 = pSVar54;
      } while (iVar37 == 0);
      if (iVar37 == 6) {
        uVar50 = (ulong)((uint)sVar51 & 0xf);
        if (uVar50 != 8) {
          uVar52 = sVar51 & 0xfffffffffffffff0;
          lVar41 = 0;
          do {
            lVar45 = lVar41 * 0x58;
            lVar1 = uVar52 + lVar45;
            uVar46 = *(ulong *)(uVar52 + 0x20 + lVar45);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar46;
            uVar11 = *(undefined8 *)(uVar52 + 0x24 + lVar45);
            bVar42 = (byte)uVar46;
            bVar94 = (byte)uVar11;
            bVar18 = (byte)(uVar46 >> 8);
            bVar113 = (byte)((ulong)uVar11 >> 8);
            bVar19 = (byte)(uVar46 >> 0x10);
            bVar114 = (byte)((ulong)uVar11 >> 0x10);
            bVar20 = (byte)(uVar46 >> 0x18);
            bVar115 = (byte)((ulong)uVar11 >> 0x18);
            bVar21 = (byte)(uVar46 >> 0x20);
            bVar116 = (byte)((ulong)uVar11 >> 0x20);
            bVar22 = (byte)(uVar46 >> 0x28);
            bVar121 = (byte)((ulong)uVar11 >> 0x28);
            bVar23 = (byte)(uVar46 >> 0x30);
            bVar122 = (byte)((ulong)uVar11 >> 0x30);
            bVar26 = (byte)((ulong)uVar11 >> 0x38);
            bVar24 = (byte)(uVar46 >> 0x38);
            auVar100[0] = -((byte)((bVar42 < bVar94) * bVar42 | (bVar42 >= bVar94) * bVar94) ==
                           bVar42);
            auVar100[1] = -((byte)((bVar18 < bVar113) * bVar18 | (bVar18 >= bVar113) * bVar113) ==
                           bVar18);
            auVar100[2] = -((byte)((bVar19 < bVar114) * bVar19 | (bVar19 >= bVar114) * bVar114) ==
                           bVar19);
            auVar100[3] = -((byte)((bVar20 < bVar115) * bVar20 | (bVar20 >= bVar115) * bVar115) ==
                           bVar20);
            auVar100[4] = -((byte)((bVar21 < bVar116) * bVar21 | (bVar21 >= bVar116) * bVar116) ==
                           bVar21);
            auVar100[5] = -((byte)((bVar22 < bVar121) * bVar22 | (bVar22 >= bVar121) * bVar121) ==
                           bVar22);
            auVar100[6] = -((byte)((bVar23 < bVar122) * bVar23 | (bVar23 >= bVar122) * bVar122) ==
                           bVar23);
            auVar100[7] = -((byte)((bVar24 < bVar26) * bVar24 | (bVar24 >= bVar26) * bVar26) ==
                           bVar24);
            auVar100[8] = 0xff;
            auVar100[9] = 0xff;
            auVar100[10] = 0xff;
            auVar100[0xb] = 0xff;
            auVar100[0xc] = 0xff;
            auVar100[0xd] = 0xff;
            auVar100[0xe] = 0xff;
            auVar100[0xf] = 0xff;
            auVar132._8_4_ = 0xffffffff;
            auVar132._0_8_ = 0xffffffffffffffff;
            auVar132._12_4_ = 0xffffffff;
            auVar72 = pmovzxbd(auVar71,auVar100 ^ auVar132);
            auVar72 = auVar72 ^ auVar132;
            auVar73._0_4_ = auVar72._0_4_ << 0x1f;
            auVar73._4_4_ = auVar72._4_4_ << 0x1f;
            auVar73._8_4_ = auVar72._8_4_ << 0x1f;
            auVar73._12_4_ = auVar72._12_4_ << 0x1f;
            uVar36 = movmskps((int)lVar41,auVar73);
            fVar92 = *(float *)(uVar52 + 0x38 + lVar45);
            fVar139 = *(float *)(uVar52 + 0x3c + lVar45);
            fVar129 = *(float *)(uVar52 + 0x44 + lVar45);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)((uVar56 >> 2) + 0x20 + lVar1);
            auVar72 = pmovzxbd(auVar74,auVar74);
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)(((uVar56 ^ 0x10) >> 2) + 0x20 + lVar1);
            auVar76 = pmovzxbd(auVar75,auVar75);
            fVar171 = *(float *)(uVar52 + 0x48 + lVar45);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = *(ulong *)((uVar61 >> 2) + 0x20 + lVar1);
            auVar102 = pmovzxbd(auVar101,auVar101);
            auVar133._8_8_ = 0;
            auVar133._0_8_ = *(ulong *)(((uVar61 ^ 0x10) >> 2) + 0x20 + lVar1);
            auVar134 = pmovzxbd(auVar133,auVar133);
            fVar85 = *(float *)(uVar52 + 0x4c + lVar45);
            auVar163._8_8_ = 0;
            auVar163._0_8_ = *(ulong *)((uVar57 >> 2) + 0x20 + lVar1);
            auVar164 = pmovzxbd(auVar163,auVar163);
            auVar175._8_8_ = 0;
            auVar175._0_8_ = *(ulong *)((uVar49 >> 2) + 0x20 + lVar1);
            auVar176 = pmovzxbd(auVar175,auVar175);
            fVar64 = *(float *)(uVar52 + 0x40 + lVar45);
            fVar86 = (((float)auVar72._0_4_ * fVar129 + fVar92) - local_11e8) * fVar6;
            fVar90 = (((float)auVar72._4_4_ * fVar129 + fVar92) - fStack_11e4) * fVar6;
            fVar95 = (((float)auVar72._8_4_ * fVar129 + fVar92) - fStack_11e0) * fVar6;
            fVar117 = (((float)auVar72._12_4_ * fVar129 + fVar92) - fStack_11dc) * fVar6;
            fVar97 = (((float)auVar102._0_4_ * fVar171 + fVar139) - local_1208) * fVar7;
            fVar119 = (((float)auVar102._4_4_ * fVar171 + fVar139) - fStack_1204) * fVar7;
            fVar62 = (((float)auVar102._8_4_ * fVar171 + fVar139) - fStack_1200) * fVar7;
            fVar83 = (((float)auVar102._12_4_ * fVar171 + fVar139) - fStack_11fc) * fVar7;
            uVar63 = (uint)((int)fVar97 < (int)fVar86) * (int)fVar86 |
                     (uint)((int)fVar97 >= (int)fVar86) * (int)fVar97;
            uVar84 = (uint)((int)fVar119 < (int)fVar90) * (int)fVar90 |
                     (uint)((int)fVar119 >= (int)fVar90) * (int)fVar119;
            uVar87 = (uint)((int)fVar62 < (int)fVar95) * (int)fVar95 |
                     (uint)((int)fVar62 >= (int)fVar95) * (int)fVar62;
            uVar91 = (uint)((int)fVar83 < (int)fVar117) * (int)fVar117 |
                     (uint)((int)fVar83 >= (int)fVar117) * (int)fVar83;
            fVar97 = (((float)auVar76._0_4_ * fVar129 + fVar92) - local_11e8) * fVar6;
            fVar119 = (((float)auVar76._4_4_ * fVar129 + fVar92) - fStack_11e4) * fVar6;
            fVar62 = (((float)auVar76._8_4_ * fVar129 + fVar92) - fStack_11e0) * fVar6;
            fVar92 = (((float)auVar76._12_4_ * fVar129 + fVar92) - fStack_11dc) * fVar6;
            fVar129 = (((float)auVar134._0_4_ * fVar171 + fVar139) - local_1208) * fVar7;
            fVar83 = (((float)auVar134._4_4_ * fVar171 + fVar139) - fStack_1204) * fVar7;
            fVar86 = (((float)auVar134._8_4_ * fVar171 + fVar139) - fStack_1200) * fVar7;
            fVar139 = (((float)auVar134._12_4_ * fVar171 + fVar139) - fStack_11fc) * fVar7;
            uVar96 = (uint)((int)fVar97 < (int)fVar129) * (int)fVar97 |
                     (uint)((int)fVar97 >= (int)fVar129) * (int)fVar129;
            uVar118 = (uint)((int)fVar119 < (int)fVar83) * (int)fVar119 |
                      (uint)((int)fVar119 >= (int)fVar83) * (int)fVar83;
            uVar124 = (uint)((int)fVar62 < (int)fVar86) * (int)fVar62 |
                      (uint)((int)fVar62 >= (int)fVar86) * (int)fVar86;
            uVar127 = (uint)((int)fVar92 < (int)fVar139) * (int)fVar92 |
                      (uint)((int)fVar92 >= (int)fVar139) * (int)fVar139;
            fVar92 = (((float)auVar164._0_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar139 = (((float)auVar164._4_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar129 = (((float)auVar164._8_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar171 = (((float)auVar164._12_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            uVar142 = (uint)((int)fVar92 < iVar9) * iVar9 |
                      (uint)((int)fVar92 >= iVar9) * (int)fVar92;
            uVar152 = (uint)((int)fVar139 < iVar9) * iVar9 |
                      (uint)((int)fVar139 >= iVar9) * (int)fVar139;
            uVar155 = (uint)((int)fVar129 < iVar9) * iVar9 |
                      (uint)((int)fVar129 >= iVar9) * (int)fVar129;
            uVar158 = (uint)((int)fVar171 < iVar9) * iVar9 |
                      (uint)((int)fVar171 >= iVar9) * (int)fVar171;
            dist.field_0.i[0] =
                 ((int)uVar142 < (int)uVar63) * uVar63 | ((int)uVar142 >= (int)uVar63) * uVar142;
            dist.field_0.i[1] =
                 ((int)uVar152 < (int)uVar84) * uVar84 | ((int)uVar152 >= (int)uVar84) * uVar152;
            dist.field_0.i[2] =
                 ((int)uVar155 < (int)uVar87) * uVar87 | ((int)uVar155 >= (int)uVar87) * uVar155;
            dist.field_0.i[3] =
                 ((int)uVar158 < (int)uVar91) * uVar91 | ((int)uVar158 >= (int)uVar91) * uVar158;
            fVar92 = (((float)auVar176._0_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar139 = (((float)auVar176._4_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar129 = (((float)auVar176._8_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            fVar171 = (((float)auVar176._12_4_ * fVar85 + fVar64) - fVar5) * fVar8;
            uVar63 = (uint)(bi_1.field_0.i[0] < (int)fVar92) * bi_1.field_0.i[0] |
                     (uint)(bi_1.field_0.i[0] >= (int)fVar92) * (int)fVar92;
            uVar84 = (uint)(bi_1.field_0.i[1] < (int)fVar139) * bi_1.field_0.i[1] |
                     (uint)(bi_1.field_0.i[1] >= (int)fVar139) * (int)fVar139;
            uVar87 = (uint)(bi_1.field_0.i[2] < (int)fVar129) * bi_1.field_0.i[2] |
                     (uint)(bi_1.field_0.i[2] >= (int)fVar129) * (int)fVar129;
            uVar91 = (uint)(bi_1.field_0.i[3] < (int)fVar171) * bi_1.field_0.i[3] |
                     (uint)(bi_1.field_0.i[3] >= (int)fVar171) * (int)fVar171;
            auVar165._0_4_ =
                 -(uint)((int)(((int)uVar96 < (int)uVar63) * uVar96 |
                              ((int)uVar96 >= (int)uVar63) * uVar63) < dist.field_0.i[0]);
            auVar165._4_4_ =
                 -(uint)((int)(((int)uVar118 < (int)uVar84) * uVar118 |
                              ((int)uVar118 >= (int)uVar84) * uVar84) < dist.field_0.i[1]);
            auVar165._8_4_ =
                 -(uint)((int)(((int)uVar124 < (int)uVar87) * uVar124 |
                              ((int)uVar124 >= (int)uVar87) * uVar87) < dist.field_0.i[2]);
            auVar165._12_4_ =
                 -(uint)((int)(((int)uVar127 < (int)uVar91) * uVar127 |
                              ((int)uVar127 >= (int)uVar91) * uVar91) < dist.field_0.i[3]);
            uVar43 = movmskps((int)lVar45,auVar165);
            bVar42 = ~(byte)uVar43 & (byte)uVar36;
            if (bVar42 != 0) {
              uVar46 = (ulong)bVar42;
              do {
                lVar45 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                  }
                }
                fVar92 = *(float *)(ray + k * 4 + 0x80);
                if (*(float *)((long)&stack[-1].ptr.ptr + lVar45 * 4) <= fVar92) {
                  uVar12 = *(ushort *)(lVar1 + lVar45 * 8);
                  uVar13 = *(ushort *)(lVar1 + 2 + lVar45 * 8);
                  uVar63 = *(uint *)(lVar1 + 0x50);
                  uVar84 = *(uint *)(lVar1 + 4 + lVar45 * 8);
                  pGVar15 = (context->scene->geometries).items[uVar63].ptr;
                  lVar16 = *(long *)&pGVar15->field_0x58;
                  lVar45 = *(long *)&pGVar15[1].time_range.upper;
                  lVar58 = (ulong)uVar84 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i;
                  uVar91 = uVar12 & 0x7fff;
                  uVar96 = uVar13 & 0x7fff;
                  uVar87 = *(uint *)(lVar16 + 4 + lVar58);
                  uVar39 = (ulong)uVar87;
                  uVar55 = (ulong)(uVar87 * uVar96 + *(int *)(lVar16 + lVar58) + uVar91);
                  p_Var17 = pGVar15[1].intersectionFilterN;
                  pfVar4 = (float *)(lVar45 + (long)p_Var17 * uVar55);
                  fVar139 = *pfVar4;
                  fVar129 = pfVar4[1];
                  fVar171 = pfVar4[2];
                  pfVar4 = (float *)(lVar45 + (uVar55 + 1) * (long)p_Var17);
                  local_11f8._0_4_ = *pfVar4;
                  local_fa8 = pfVar4[1];
                  fVar85 = pfVar4[2];
                  pfVar4 = (float *)(lVar45 + (uVar55 + uVar39) * (long)p_Var17);
                  fVar64 = *pfVar4;
                  fVar97 = pfVar4[1];
                  fVar119 = pfVar4[2];
                  lVar59 = uVar55 + uVar39 + 1;
                  pfVar4 = (float *)(lVar45 + lVar59 * (long)p_Var17);
                  fVar62 = *pfVar4;
                  fVar83 = pfVar4[1];
                  fVar86 = pfVar4[2];
                  uVar48 = (ulong)(-1 < (short)uVar12);
                  pfVar4 = (float *)(lVar45 + (uVar55 + uVar48 + 1) * (long)p_Var17);
                  local_11f8._4_4_ = *pfVar4;
                  lVar60 = uVar48 + lVar59;
                  pfVar2 = (float *)(lVar45 + lVar60 * (long)p_Var17);
                  fVar90 = *pfVar2;
                  fVar95 = pfVar2[1];
                  fVar117 = pfVar2[2];
                  uVar48 = 0;
                  if (-1 < (short)uVar13) {
                    uVar48 = uVar39;
                  }
                  pfVar2 = (float *)(lVar45 + (uVar55 + uVar39 + uVar48) * (long)p_Var17);
                  fVar93 = *pfVar2;
                  fVar140 = pfVar2[1];
                  pfVar3 = (float *)(lVar45 + (lVar59 + uVar48) * (long)p_Var17);
                  fVar89 = *pfVar3;
                  fVar214 = pfVar3[1];
                  fVar183 = pfVar3[2];
                  lVar45 = lVar45 + (uVar48 + lVar60) * (long)p_Var17;
                  fVar211 = *(float *)(lVar45 + 4);
                  fVar182 = *(float *)(lVar45 + 8);
                  local_11f8 = CONCAT44(local_11f8._4_4_,(float)local_11f8);
                  local_11e8 = fVar90;
                  fStack_11e4 = fVar62;
                  local_1048 = fVar183;
                  fStack_1044 = pfVar2[2];
                  fStack_fa4 = pfVar4[1];
                  fStack_fa0 = fVar95;
                  fStack_f9c = fVar83;
                  fVar160 = fVar129 - local_fa8;
                  fVar169 = local_fa8 - pfVar4[1];
                  fVar170 = fVar83 - fVar95;
                  fVar172 = fVar97 - fVar83;
                  local_f98 = CONCAT44(pfVar4[2],fVar85);
                  dist.field_0.v[0] = fVar117;
                  dist.field_0.v[1] = fVar86;
                  fVar205 = fVar171 - fVar85;
                  fVar207 = fVar85 - pfVar4[2];
                  fVar209 = fVar86 - fVar117;
                  fVar212 = fVar119 - fVar86;
                  fVar184 = fVar97 - fVar129;
                  fVar188 = fVar83 - local_fa8;
                  fVar189 = fVar214 - fVar83;
                  fVar190 = fVar140 - fVar97;
                  fVar191 = fVar119 - fVar171;
                  fVar193 = fVar86 - fVar85;
                  fVar194 = fVar183 - fVar86;
                  fVar195 = pfVar2[2] - fVar119;
                  fVar143 = fVar205 * fVar184 - fVar160 * fVar191;
                  fVar153 = fVar207 * fVar188 - fVar169 * fVar193;
                  local_1238._4_4_ = fVar153;
                  local_1238._0_4_ = fVar143;
                  fVar156 = fVar209 * fVar189 - fVar170 * fVar194;
                  fVar159 = fVar212 * fVar190 - fVar172 * fVar195;
                  fVar173 = fVar64 - fVar139;
                  fVar178 = fVar62 - (float)local_11f8;
                  fVar179 = fVar89 - fVar62;
                  fVar180 = fVar93 - fVar64;
                  fVar123 = *(float *)(ray + k * 4);
                  fVar130 = fVar139 - fVar123;
                  fVar137 = (float)local_11f8 - fVar123;
                  fVar138 = fVar62 - fVar123;
                  fVar123 = fVar64 - fVar123;
                  fVar126 = *(float *)(ray + k * 4 + 0x10);
                  fVar129 = fVar129 - fVar126;
                  fVar196 = local_fa8 - fVar126;
                  fVar197 = fVar83 - fVar126;
                  fVar126 = fVar97 - fVar126;
                  fVar141 = *(float *)(ray + k * 4 + 0x40);
                  fVar151 = *(float *)(ray + k * 4 + 0x50);
                  fVar215 = fVar130 * fVar151 - fVar129 * fVar141;
                  fVar216 = fVar137 * fVar151 - fVar196 * fVar141;
                  fVar217 = fVar138 * fVar151 - fVar197 * fVar141;
                  fVar218 = fVar123 * fVar151 - fVar126 * fVar141;
                  fVar139 = fVar139 - (float)local_11f8;
                  fVar198 = (float)local_11f8 - local_11f8._4_4_;
                  fVar199 = fVar62 - fVar90;
                  fVar200 = fVar64 - fVar62;
                  local_1228._0_4_ = fVar139 * fVar191 - fVar205 * fVar173;
                  local_1228._4_4_ = fVar198 * fVar193 - fVar207 * fVar178;
                  fStack_1220 = fVar199 * fVar194 - fVar209 * fVar179;
                  fStack_121c = fVar200 * fVar195 - fVar212 * fVar180;
                  fVar154 = *(float *)(ray + k * 4 + 0x20);
                  fVar171 = fVar171 - fVar154;
                  fVar85 = fVar85 - fVar154;
                  fVar88 = fVar86 - fVar154;
                  fVar154 = fVar119 - fVar154;
                  fVar157 = *(float *)(ray + k * 4 + 0x60);
                  fVar98 = fVar171 * fVar141 - fVar130 * fVar157;
                  fVar120 = fVar85 * fVar141 - fVar137 * fVar157;
                  fVar125 = fVar88 * fVar141 - fVar138 * fVar157;
                  fVar128 = fVar154 * fVar141 - fVar123 * fVar157;
                  local_1218._0_4_ = fVar160 * fVar173 - fVar139 * fVar184;
                  local_1218._4_4_ = fVar169 * fVar178 - fVar198 * fVar188;
                  fStack_1210 = fVar170 * fVar179 - fVar199 * fVar189;
                  fStack_120c = fVar172 * fVar180 - fVar200 * fVar190;
                  fVar206 = fVar129 * fVar157 - fVar171 * fVar151;
                  fVar208 = fVar196 * fVar157 - fVar85 * fVar151;
                  fVar210 = fVar197 * fVar157 - fVar88 * fVar151;
                  fVar213 = fVar126 * fVar157 - fVar154 * fVar151;
                  fStack_1230 = fVar156;
                  fStack_122c = fVar159;
                  fVar201 = fVar141 * fVar143 +
                            fVar151 * (float)local_1228._0_4_ + fVar157 * (float)local_1218._0_4_;
                  fVar202 = fVar141 * fVar153 +
                            fVar151 * (float)local_1228._4_4_ + fVar157 * (float)local_1218._4_4_;
                  fVar203 = fVar141 * fVar156 + fVar151 * fStack_1220 + fVar157 * fStack_1210;
                  fVar204 = fVar141 * fVar159 + fVar151 * fStack_121c + fVar157 * fStack_120c;
                  uVar118 = (uint)fVar201 & 0x80000000;
                  uVar124 = (uint)fVar202 & 0x80000000;
                  uVar127 = (uint)fVar203 & 0x80000000;
                  uVar142 = (uint)fVar204 & 0x80000000;
                  auVar145._4_4_ = fVar90;
                  auVar145._0_4_ = fVar62;
                  auVar145._8_4_ = fStack_1360;
                  auVar145._12_4_ = fStack_135c;
                  fVar141 = (float)((uint)(fVar173 * fVar206 + fVar184 * fVar98 + fVar191 * fVar215)
                                   ^ uVar118);
                  fVar151 = (float)((uint)(fVar178 * fVar208 + fVar188 * fVar120 + fVar193 * fVar216
                                          ) ^ uVar124);
                  fVar157 = (float)((uint)(fVar179 * fVar210 + fVar189 * fVar125 + fVar194 * fVar217
                                          ) ^ uVar127);
                  fVar173 = (float)((uint)(fVar180 * fVar213 + fVar190 * fVar128 + fVar195 * fVar218
                                          ) ^ uVar142);
                  fVar160 = (float)((uint)(fVar206 * fVar139 + fVar98 * fVar160 + fVar215 * fVar205)
                                   ^ uVar118);
                  fVar120 = (float)((uint)(fVar208 * fVar198 + fVar120 * fVar169 + fVar216 * fVar207
                                          ) ^ uVar124);
                  fVar125 = (float)((uint)(fVar210 * fVar199 + fVar125 * fVar170 + fVar217 * fVar209
                                          ) ^ uVar127);
                  fVar128 = (float)((uint)(fVar213 * fVar200 + fVar128 * fVar172 + fVar218 * fVar212
                                          ) ^ uVar142);
                  fVar139 = ABS(fVar201);
                  fVar98 = ABS(fVar202);
                  auVar185._0_8_ = CONCAT44(fVar202,fVar201) & 0x7fffffff7fffffff;
                  auVar185._8_4_ = ABS(fVar203);
                  auVar185._12_4_ = ABS(fVar204);
                  bVar29 = fVar141 + fVar160 <= fVar139 &&
                           ((0.0 <= fVar141 && 0.0 <= fVar160) && fVar201 != 0.0);
                  bVar30 = fVar151 + fVar120 <= fVar98 &&
                           ((0.0 <= fVar151 && 0.0 <= fVar120) && fVar202 != 0.0);
                  bVar28 = ((0.0 <= fVar157 && 0.0 <= fVar125) && fVar203 != 0.0) &&
                           fVar157 + fVar125 <= auVar185._8_4_;
                  bVar27 = ((0.0 <= fVar173 && 0.0 <= fVar128) && fVar204 != 0.0) &&
                           fVar173 + fVar128 <= auVar185._12_4_;
                  auVar25._4_4_ = -(uint)bVar30;
                  auVar25._0_4_ = -(uint)bVar29;
                  auVar25._8_4_ = -(uint)bVar28;
                  auVar25._12_4_ = -(uint)bVar27;
                  uVar87 = movmskps(uVar87,auVar25);
                  local_fb8 = ZEXT416(uVar91);
                  if (uVar87 != 0) {
                    fVar171 = (float)(uVar118 ^
                                     (uint)(fVar130 * fVar143 +
                                           fVar129 * (float)local_1228._0_4_ +
                                           fVar171 * (float)local_1218._0_4_));
                    fVar85 = (float)(uVar124 ^
                                    (uint)(fVar137 * fVar153 +
                                          fVar196 * (float)local_1228._4_4_ +
                                          fVar85 * (float)local_1218._4_4_));
                    fVar88 = (float)(uVar127 ^
                                    (uint)(fVar138 * fVar156 +
                                          fVar197 * fStack_1220 + fVar88 * fStack_1210));
                    fVar123 = (float)(uVar142 ^
                                     (uint)(fVar123 * fVar159 +
                                           fVar126 * fStack_121c + fVar154 * fStack_120c));
                    fVar129 = *(float *)(ray + k * 4 + 0x30);
                    bVar29 = (fVar129 * fVar139 < fVar171 && fVar171 <= fVar92 * fVar139) && bVar29;
                    valid.field_0.i[0] = -(uint)bVar29;
                    bVar30 = (fVar129 * fVar98 < fVar85 && fVar85 <= fVar92 * fVar98) && bVar30;
                    valid.field_0.i[1] = -(uint)bVar30;
                    bVar28 = (fVar129 * auVar185._8_4_ < fVar88 && fVar88 <= fVar92 * auVar185._8_4_
                             ) && bVar28;
                    valid.field_0.i[2] = -(uint)bVar28;
                    bVar27 = (fVar129 * auVar185._12_4_ < fVar123 &&
                             fVar123 <= fVar92 * auVar185._12_4_) && bVar27;
                    valid.field_0.i[3] = -(uint)bVar27;
                    uVar87 = movmskps(uVar87,(undefined1  [16])valid.field_0);
                    if (uVar87 != 0) {
                      auVar135._4_12_ = local_1238._4_12_;
                      auVar135._0_4_ = (float)(int)(*(ushort *)(lVar16 + 8 + lVar58) - 1);
                      auVar166._4_4_ = fVar153;
                      auVar166._0_4_ = auVar135._0_4_;
                      auVar166._8_4_ = fVar156;
                      auVar166._12_4_ = fVar159;
                      auVar72 = rcpss(auVar166,auVar135);
                      fVar92 = (2.0 - auVar135._0_4_ * auVar72._0_4_) * auVar72._0_4_;
                      auVar167._4_12_ = auVar72._4_12_;
                      auVar167._0_4_ = (float)(int)(*(ushort *)(lVar16 + 10 + lVar58) - 1);
                      auVar177._4_4_ = auVar72._4_4_;
                      auVar177._0_4_ = auVar167._0_4_;
                      auVar177._8_4_ = auVar72._8_4_;
                      auVar177._12_4_ = auVar72._12_4_;
                      auVar72 = rcpss(auVar177,auVar167);
                      fVar129 = (2.0 - auVar167._0_4_ * auVar72._0_4_) * auVar72._0_4_;
                      tNear.field_0.v[0] = fVar92 * ((float)uVar91 * fVar139 + fVar141);
                      tNear.field_0.v[1] = fVar92 * ((float)(uVar91 + 1) * fVar98 + fVar151);
                      tNear.field_0.v[2] = fVar92 * ((float)(uVar91 + 1) * auVar185._8_4_ + fVar157)
                      ;
                      tNear.field_0.v[3] = fVar92 * ((float)uVar91 * auVar185._12_4_ + fVar173);
                      pGVar15 = (context->scene->geometries).items[uVar63].ptr;
                      uVar87 = *(uint *)(ray + k * 4 + 0x90);
                      if ((pGVar15->mask & uVar87) != 0) {
                        auVar72 = rcpps(auVar145,auVar185);
                        fVar92 = auVar72._0_4_;
                        fVar126 = auVar72._4_4_;
                        fVar141 = auVar72._8_4_;
                        fVar151 = auVar72._12_4_;
                        fVar92 = (1.0 - fVar139 * fVar92) * fVar92 + fVar92;
                        fVar126 = (1.0 - fVar98 * fVar126) * fVar126 + fVar126;
                        fVar141 = (1.0 - auVar185._8_4_ * fVar141) * fVar141 + fVar141;
                        fVar151 = (1.0 - auVar185._12_4_ * fVar151) * fVar151 + fVar151;
                        local_1248._0_4_ = fVar171 * fVar92;
                        local_1248._4_4_ = fVar85 * fVar126;
                        local_1248._8_4_ = fVar88 * fVar141;
                        local_1248._12_4_ = fVar123 * fVar151;
                        local_1268[0] = tNear.field_0.v[0] * fVar92;
                        local_1268[1] = tNear.field_0.v[1] * fVar126;
                        local_1268[2] = tNear.field_0.v[2] * fVar141;
                        local_1268[3] = tNear.field_0.v[3] * fVar151;
                        local_1258[0] = fVar129 * ((float)uVar96 * fVar139 + fVar160) * fVar92;
                        local_1258[1] = fVar129 * ((float)uVar96 * fVar98 + fVar120) * fVar126;
                        local_1258[2] =
                             fVar129 * ((float)(uVar96 + 1) * auVar185._8_4_ + fVar125) * fVar141;
                        local_1258[3] =
                             fVar129 * ((float)(uVar96 + 1) * auVar185._12_4_ + fVar128) * fVar151;
                        auVar76 = blendvps(_DAT_01feb9f0,local_1248,(undefined1  [16])valid.field_0)
                        ;
                        auVar147._4_4_ = auVar76._0_4_;
                        auVar147._0_4_ = auVar76._4_4_;
                        auVar147._8_4_ = auVar76._12_4_;
                        auVar147._12_4_ = auVar76._8_4_;
                        auVar72 = minps(auVar147,auVar76);
                        auVar103._0_8_ = auVar72._8_8_;
                        auVar103._8_4_ = auVar72._0_4_;
                        auVar103._12_4_ = auVar72._4_4_;
                        auVar72 = minps(auVar103,auVar72);
                        auVar104._0_8_ =
                             CONCAT44(-(uint)(auVar72._4_4_ == auVar76._4_4_ && bVar30),
                                      -(uint)(auVar72._0_4_ == auVar76._0_4_ && bVar29));
                        auVar104._8_4_ = -(uint)(auVar72._8_4_ == auVar76._8_4_ && bVar28);
                        auVar104._12_4_ = -(uint)(auVar72._12_4_ == auVar76._12_4_ && bVar27);
                        iVar37 = movmskps(uVar87,auVar104);
                        aVar77 = valid.field_0;
                        if (iVar37 != 0) {
                          aVar77.i[2] = auVar104._8_4_;
                          aVar77._0_8_ = auVar104._0_8_;
                          aVar77.i[3] = auVar104._12_4_;
                        }
                        uVar87 = movmskps(iVar37,(undefined1  [16])aVar77);
                        lVar45 = 0;
                        if (uVar87 != 0) {
                          for (; (uVar87 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar92 = local_1268[lVar45];
                          fVar139 = local_1258[lVar45];
                          uVar36 = *(undefined4 *)(local_1238 + lVar45 * 4);
                          uVar43 = *(undefined4 *)(local_1228 + lVar45 * 4);
                          uVar10 = *(undefined4 *)(local_1218 + lVar45 * 4);
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_1248 + lVar45 * 4);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar36;
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar43;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                          *(float *)(ray + k * 4 + 0xf0) = fVar92;
                          *(float *)(ray + k * 4 + 0x100) = fVar139;
                          *(uint *)(ray + k * 4 + 0x110) = uVar84;
                          *(uint *)(ray + k * 4 + 0x120) = uVar63;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar87 = context->user->instPrimID[0];
                          *(uint *)(ray + k * 4 + 0x140) = uVar87;
                        }
                        else {
                          uVar11 = *(undefined8 *)(mm_lookupmask_ps + lVar38);
                          uVar31 = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
                          do {
                            uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
                            local_1018 = local_1268[lVar45];
                            local_1008 = local_1258[lVar45];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_1248 + lVar45 * 4);
                            args.context = context->user;
                            local_1048 = *(float *)(local_1238 + lVar45 * 4);
                            local_1038._4_4_ = *(undefined4 *)(local_1228 + lVar45 * 4);
                            local_1028._4_4_ = *(undefined4 *)(local_1218 + lVar45 * 4);
                            fStack_1044 = local_1048;
                            uStack_1040 = local_1048;
                            uStack_103c = local_1048;
                            local_1038._0_4_ = local_1038._4_4_;
                            local_1038._8_4_ = local_1038._4_4_;
                            local_1038._12_4_ = local_1038._4_4_;
                            local_1028._0_4_ = local_1028._4_4_;
                            local_1028._8_4_ = local_1028._4_4_;
                            local_1028._12_4_ = local_1028._4_4_;
                            fStack_1014 = local_1018;
                            fStack_1010 = local_1018;
                            fStack_100c = local_1018;
                            fStack_1004 = local_1008;
                            fStack_1000 = local_1008;
                            fStack_ffc = local_1008;
                            local_ff8 = CONCAT44(uVar84,uVar84);
                            uStack_ff0 = CONCAT44(uVar84,uVar84);
                            local_fe8 = CONCAT44(uVar63,uVar63);
                            uStack_fe0 = CONCAT44(uVar63,uVar63);
                            local_fd8 = (args.context)->instID[0];
                            uStack_fd4 = local_fd8;
                            uStack_fd0 = local_fd8;
                            uStack_fcc = local_fd8;
                            local_fc8 = (args.context)->instPrimID[0];
                            uStack_fc4 = local_fc8;
                            uStack_fc0 = local_fc8;
                            uStack_fbc = local_fc8;
                            args.valid = (int *)&local_1348;
                            pRVar47 = (RTCIntersectArguments *)pGVar15->userPtr;
                            args.hit = (RTCHitN *)&local_1048;
                            args.N = 4;
                            pRVar40 = (RTCRayN *)pGVar15->intersectionFilterN;
                            local_1348 = uVar11;
                            uStack_1340 = uVar31;
                            args.geometryUserPtr = pRVar47;
                            args.ray = (RTCRayN *)ray;
                            if (pRVar40 != (RTCRayN *)0x0) {
                              pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                            }
                            auVar32._8_8_ = uStack_1340;
                            auVar32._0_8_ = local_1348;
                            if (auVar32 == (undefined1  [16])0x0) {
                              auVar107._8_4_ = 0xffffffff;
                              auVar107._0_8_ = 0xffffffffffffffff;
                              auVar107._12_4_ = 0xffffffff;
                              auVar107 = auVar107 ^ _DAT_01febe20;
                            }
                            else {
                              pRVar47 = context->args;
                              pRVar40 = (RTCRayN *)pRVar47->filter;
                              if ((pRVar40 != (RTCRayN *)0x0) &&
                                 (((pRVar47->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                              }
                              auVar33._8_8_ = uStack_1340;
                              auVar33._0_8_ = local_1348;
                              auVar79._0_4_ = -(uint)((int)local_1348 == 0);
                              auVar79._4_4_ = -(uint)((int)((ulong)local_1348 >> 0x20) == 0);
                              auVar79._8_4_ = -(uint)((int)uStack_1340 == 0);
                              auVar79._12_4_ = -(uint)((int)((ulong)uStack_1340 >> 0x20) == 0);
                              auVar107 = auVar79 ^ _DAT_01febe20;
                              if (auVar33 != (undefined1  [16])0x0) {
                                auVar72 = blendvps(*(undefined1 (*) [16])args.hit,
                                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar79);
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar79);
                                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar79);
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar79);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar79)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x100) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar79)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x110) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar79)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x120) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar79)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar79)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x140) = auVar72;
                                pRVar40 = args.ray;
                                pRVar47 = (RTCIntersectArguments *)args.hit;
                              }
                            }
                            if ((_DAT_01fecb20 & auVar107) == (undefined1  [16])0x0) {
                              *(undefined4 *)(ray + k * 4 + 0x80) = uVar36;
                            }
                            valid.field_0.v[lVar45] = 0.0;
                            fVar92 = *(float *)(ray + k * 4 + 0x80);
                            valid.field_0.i[0] =
                                 -(uint)(local_1248._0_4_ <= fVar92) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(local_1248._4_4_ <= fVar92) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(local_1248._8_4_ <= fVar92) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(local_1248._12_4_ <= fVar92) & valid.field_0.i[3];
                            uVar87 = movmskps((int)pRVar40,(undefined1  [16])valid.field_0);
                            if (uVar87 != 0) {
                              auVar76 = blendvps(_DAT_01feb9f0,local_1248,
                                                 (undefined1  [16])valid.field_0);
                              auVar149._4_4_ = auVar76._0_4_;
                              auVar149._0_4_ = auVar76._4_4_;
                              auVar149._8_4_ = auVar76._12_4_;
                              auVar149._12_4_ = auVar76._8_4_;
                              auVar72 = minps(auVar149,auVar76);
                              auVar108._0_8_ = auVar72._8_8_;
                              auVar108._8_4_ = auVar72._0_4_;
                              auVar108._12_4_ = auVar72._4_4_;
                              auVar72 = minps(auVar108,auVar72);
                              auVar109._0_8_ =
                                   CONCAT44(-(uint)(auVar72._4_4_ == auVar76._4_4_) &
                                            valid.field_0.i[1],
                                            -(uint)(auVar72._0_4_ == auVar76._0_4_) &
                                            valid.field_0.i[0]);
                              auVar109._8_4_ =
                                   -(uint)(auVar72._8_4_ == auVar76._8_4_) & valid.field_0.i[2];
                              auVar109._12_4_ =
                                   -(uint)(auVar72._12_4_ == auVar76._12_4_) & valid.field_0.i[3];
                              iVar37 = movmskps((int)pRVar47,auVar109);
                              aVar80 = valid.field_0;
                              if (iVar37 != 0) {
                                aVar80.i[2] = auVar109._8_4_;
                                aVar80._0_8_ = auVar109._0_8_;
                                aVar80.i[3] = auVar109._12_4_;
                              }
                              uVar36 = movmskps(iVar37,(undefined1  [16])aVar80);
                              uVar48 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar36);
                              lVar45 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                                }
                              }
                            }
                          } while ((char)uVar87 != '\0');
                        }
                      }
                    }
                  }
                  fVar123 = auVar145._0_4_;
                  fVar126 = auVar145._4_4_;
                  fVar141 = auVar145._8_4_;
                  fVar157 = auVar145._12_4_;
                  fVar64 = fVar123 - fVar64;
                  fVar62 = fVar126 - fVar62;
                  fVar89 = fVar141 - fVar89;
                  fVar93 = fVar157 - fVar93;
                  fVar97 = fVar83 - fVar97;
                  fVar151 = fVar95 - fVar83;
                  fVar154 = fVar211 - fVar214;
                  fVar140 = fVar214 - fVar140;
                  fVar119 = fVar86 - fVar119;
                  fVar125 = fVar117 - fVar86;
                  fVar128 = fVar182 - fStack_1050;
                  fVar130 = fVar183 - fStack_104c;
                  local_11f8._0_4_ = (float)local_11f8 - fVar123;
                  local_11f8._4_4_ = local_11f8._4_4_ - fVar126;
                  fVar172 = (float)uStack_11f0 - fVar141;
                  fVar173 = uStack_11f0._4_4_ - fVar157;
                  fVar169 = local_fa8 - fVar83;
                  fVar170 = fStack_fa4 - fVar95;
                  fVar178 = fStack_fa0 - fVar211;
                  fVar179 = fStack_f9c - fVar214;
                  fVar180 = (float)local_f98 - fVar86;
                  fVar184 = local_f98._4_4_ - fVar117;
                  fVar188 = fStack_f90 - fVar182;
                  fVar189 = fStack_f8c - fVar183;
                  local_1238._0_4_ = fVar169 * fVar119 - fVar180 * fVar97;
                  local_1238._4_4_ = fVar170 * fVar125 - fVar184 * fVar151;
                  fStack_1230 = fVar178 * fVar128 - fVar188 * fVar154;
                  fStack_122c = fVar179 * fVar130 - fVar189 * fVar140;
                  local_1228._0_4_ = fVar180 * fVar64 - (float)local_11f8 * fVar119;
                  local_1228._4_4_ = fVar184 * fVar62 - local_11f8._4_4_ * fVar125;
                  fStack_1220 = fVar188 * fVar89 - fVar172 * fVar128;
                  fStack_121c = fVar189 * fVar93 - fVar173 * fVar130;
                  local_1218._0_4_ = (float)local_11f8 * fVar97 - fVar169 * fVar64;
                  local_1218._4_4_ = local_11f8._4_4_ * fVar151 - fVar170 * fVar62;
                  fStack_1210 = fVar172 * fVar154 - fVar178 * fVar89;
                  fStack_120c = fVar173 * fVar140 - fVar179 * fVar93;
                  fVar92 = *(float *)(ray + k * 4);
                  fVar139 = *(float *)(ray + k * 4 + 0x10);
                  fVar129 = *(float *)(ray + k * 4 + 0x20);
                  fVar171 = *(float *)(ray + k * 4 + 0x40);
                  fVar85 = *(float *)(ray + k * 4 + 0x50);
                  fVar90 = *(float *)(ray + k * 4 + 0x60);
                  fVar123 = fVar123 - fVar92;
                  fVar126 = fVar126 - fVar92;
                  fStack_1360 = fVar141 - fVar92;
                  fStack_135c = fVar157 - fVar92;
                  fVar83 = fVar83 - fVar139;
                  fVar95 = fVar95 - fVar139;
                  fVar211 = fVar211 - fVar139;
                  fVar214 = fVar214 - fVar139;
                  fVar86 = fVar86 - fVar129;
                  fVar117 = fVar117 - fVar129;
                  fVar182 = fVar182 - fVar129;
                  fVar183 = fVar183 - fVar129;
                  fVar157 = fVar83 * fVar90 - fVar86 * fVar85;
                  fVar88 = fVar95 * fVar90 - fVar117 * fVar85;
                  fVar98 = fVar211 * fVar90 - fVar182 * fVar85;
                  fVar120 = fVar214 * fVar90 - fVar183 * fVar85;
                  fVar137 = fVar86 * fVar171 - fVar123 * fVar90;
                  fVar138 = fVar117 * fVar171 - fVar126 * fVar90;
                  fVar143 = fVar182 * fVar171 - fStack_1360 * fVar90;
                  fVar153 = fVar183 * fVar171 - fStack_135c * fVar90;
                  fVar92 = fVar123 * fVar85 - fVar83 * fVar171;
                  fVar139 = fVar126 * fVar85 - fVar95 * fVar171;
                  fVar129 = fStack_1360 * fVar85 - fVar211 * fVar171;
                  fVar141 = fStack_135c * fVar85 - fVar214 * fVar171;
                  fVar156 = fVar171 * (float)local_1238._0_4_ +
                            fVar85 * (float)local_1228._0_4_ + fVar90 * (float)local_1218._0_4_;
                  fVar159 = fVar171 * (float)local_1238._4_4_ +
                            fVar85 * (float)local_1228._4_4_ + fVar90 * (float)local_1218._4_4_;
                  fVar160 = fVar171 * fStack_1230 + fVar85 * fStack_1220 + fVar90 * fStack_1210;
                  fVar90 = fVar171 * fStack_122c + fVar85 * fStack_121c + fVar90 * fStack_120c;
                  uVar91 = (uint)fVar156 & 0x80000000;
                  uVar118 = (uint)fVar159 & 0x80000000;
                  uVar124 = (uint)fVar160 & 0x80000000;
                  uVar127 = (uint)fVar90 & 0x80000000;
                  fVar169 = (float)((uint)((float)local_11f8 * fVar157 +
                                          fVar169 * fVar137 + fVar180 * fVar92) ^ uVar91);
                  fVar170 = (float)((uint)(local_11f8._4_4_ * fVar88 +
                                          fVar170 * fVar138 + fVar184 * fVar139) ^ uVar118);
                  fVar172 = (float)((uint)(fVar172 * fVar98 + fVar178 * fVar143 + fVar188 * fVar129)
                                   ^ uVar124);
                  fVar173 = (float)((uint)(fVar173 * fVar120 + fVar179 * fVar153 + fVar189 * fVar141
                                          ) ^ uVar127);
                  fVar171 = (float)((uint)(fVar157 * fVar64 + fVar137 * fVar97 + fVar92 * fVar119) ^
                                   uVar91);
                  fVar85 = (float)((uint)(fVar88 * fVar62 + fVar138 * fVar151 + fVar139 * fVar125) ^
                                  uVar118);
                  fVar129 = (float)((uint)(fVar98 * fVar89 + fVar143 * fVar154 + fVar129 * fVar128)
                                   ^ uVar124);
                  fVar64 = (float)((uint)(fVar120 * fVar93 + fVar153 * fVar140 + fVar141 * fVar130)
                                  ^ uVar127);
                  fVar92 = ABS(fVar156);
                  fVar139 = ABS(fVar159);
                  auVar146._0_8_ = CONCAT44(fVar159,fVar156) & 0x7fffffff7fffffff;
                  auVar146._8_4_ = ABS(fVar160);
                  auVar146._12_4_ = ABS(fVar90);
                  bVar29 = fVar169 + fVar171 <= fVar92 &&
                           ((0.0 <= fVar169 && 0.0 <= fVar171) && fVar156 != 0.0);
                  auVar181._0_4_ = -(uint)bVar29;
                  bVar30 = fVar170 + fVar85 <= fVar139 &&
                           ((0.0 <= fVar170 && 0.0 <= fVar85) && fVar159 != 0.0);
                  auVar181._4_4_ = -(uint)bVar30;
                  bVar28 = fVar172 + fVar129 <= auVar146._8_4_ &&
                           ((0.0 <= fVar172 && 0.0 <= fVar129) && fVar160 != 0.0);
                  auVar181._8_4_ = -(uint)bVar28;
                  bVar27 = fVar173 + fVar64 <= auVar146._12_4_ &&
                           ((0.0 <= fVar173 && 0.0 <= fVar64) && fVar90 != 0.0);
                  auVar181._12_4_ = -(uint)bVar27;
                  iVar37 = movmskps(uVar87,auVar181);
                  if (iVar37 != 0) {
                    fVar62 = (float)(uVar91 ^ (uint)(fVar123 * (float)local_1238._0_4_ +
                                                    fVar83 * (float)local_1228._0_4_ +
                                                    fVar86 * (float)local_1218._0_4_));
                    fVar83 = (float)(uVar118 ^
                                    (uint)(fVar126 * (float)local_1238._4_4_ +
                                          fVar95 * (float)local_1228._4_4_ +
                                          fVar117 * (float)local_1218._4_4_));
                    fVar86 = (float)(uVar124 ^
                                    (uint)(fStack_1360 * fStack_1230 +
                                          fVar211 * fStack_1220 + fVar182 * fStack_1210));
                    fVar90 = (float)(uVar127 ^
                                    (uint)(fStack_135c * fStack_122c +
                                          fVar214 * fStack_121c + fVar183 * fStack_120c));
                    fVar97 = *(float *)(ray + k * 4 + 0x30);
                    fVar119 = *(float *)(ray + k * 4 + 0x80);
                    bVar29 = (fVar62 <= fVar119 * fVar92 && fVar97 * fVar92 < fVar62) && bVar29;
                    valid.field_0.i[0] = -(uint)bVar29;
                    bVar30 = (fVar83 <= fVar119 * fVar139 && fVar97 * fVar139 < fVar83) && bVar30;
                    valid.field_0.i[1] = -(uint)bVar30;
                    bVar28 = (fVar86 <= fVar119 * auVar146._8_4_ && fVar97 * auVar146._8_4_ < fVar86
                             ) && bVar28;
                    valid.field_0.i[2] = -(uint)bVar28;
                    bVar27 = (fVar90 <= fVar119 * auVar146._12_4_ &&
                             fVar97 * auVar146._12_4_ < fVar90) && bVar27;
                    valid.field_0.i[3] = -(uint)bVar27;
                    iVar37 = movmskps(iVar37,(undefined1  [16])valid.field_0);
                    if (iVar37 != 0) {
                      auVar136._4_12_ = local_1218._4_12_;
                      auVar136._0_4_ = (float)(int)(*(ushort *)(lVar16 + 8 + lVar58) - 1);
                      auVar186._4_4_ = local_1218._4_4_;
                      auVar186._0_4_ = auVar136._0_4_;
                      auVar186._8_4_ = fStack_1210;
                      auVar186._12_4_ = fStack_120c;
                      auVar72 = rcpss(auVar186,auVar136);
                      fVar97 = (2.0 - auVar136._0_4_ * auVar72._0_4_) * auVar72._0_4_;
                      auVar187._4_12_ = auVar72._4_12_;
                      auVar187._0_4_ = (float)(int)(*(ushort *)(lVar16 + 10 + lVar58) - 1);
                      auVar192._4_4_ = auVar72._4_4_;
                      auVar192._0_4_ = auVar187._0_4_;
                      auVar192._8_4_ = auVar72._8_4_;
                      auVar192._12_4_ = auVar72._12_4_;
                      auVar72 = rcpss(auVar192,auVar187);
                      fVar119 = (2.0 - auVar187._0_4_ * auVar72._0_4_) * auVar72._0_4_;
                      tNear.field_0.v[0] =
                           fVar97 * ((float)(int)local_fb8._0_4_ * fVar92 + (fVar92 - fVar169));
                      tNear.field_0.v[1] =
                           fVar97 * ((float)(local_fb8._0_4_ + 1) * fVar139 + (fVar139 - fVar170));
                      tNear.field_0.v[2] =
                           fVar97 * ((float)(local_fb8._0_4_ + 1) * auVar146._8_4_ +
                                    (auVar146._8_4_ - fVar172));
                      tNear.field_0.v[3] =
                           fVar97 * ((float)(int)local_fb8._0_4_ * auVar146._12_4_ +
                                    (auVar146._12_4_ - fVar173));
                      auVar168._0_4_ = (float)uVar96 * fVar92 + (fVar92 - fVar171);
                      auVar168._4_4_ = (float)uVar96 * fVar139 + (fVar139 - fVar85);
                      auVar168._8_4_ =
                           (float)(uVar96 + 1) * auVar146._8_4_ + (auVar146._8_4_ - fVar129);
                      auVar168._12_4_ =
                           (float)(uVar96 + 1) * auVar146._12_4_ + (auVar146._12_4_ - fVar64);
                      pGVar15 = (context->scene->geometries).items[uVar63].ptr;
                      if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar72 = rcpps(auVar168,auVar146);
                        fVar129 = auVar72._0_4_;
                        fVar171 = auVar72._4_4_;
                        fVar85 = auVar72._8_4_;
                        fVar64 = auVar72._12_4_;
                        fVar129 = (1.0 - fVar92 * fVar129) * fVar129 + fVar129;
                        fVar171 = (1.0 - fVar139 * fVar171) * fVar171 + fVar171;
                        fVar85 = (1.0 - auVar146._8_4_ * fVar85) * fVar85 + fVar85;
                        fVar64 = (1.0 - auVar146._12_4_ * fVar64) * fVar64 + fVar64;
                        local_1248._0_4_ = fVar62 * fVar129;
                        local_1248._4_4_ = fVar83 * fVar171;
                        local_1248._8_4_ = fVar86 * fVar85;
                        local_1248._12_4_ = fVar90 * fVar64;
                        local_1268[0] = tNear.field_0.v[0] * fVar129;
                        local_1268[1] = tNear.field_0.v[1] * fVar171;
                        local_1268[2] = tNear.field_0.v[2] * fVar85;
                        local_1268[3] = tNear.field_0.v[3] * fVar64;
                        local_1258[0] = fVar119 * auVar168._0_4_ * fVar129;
                        local_1258[1] = fVar119 * auVar168._4_4_ * fVar171;
                        local_1258[2] = fVar119 * auVar168._8_4_ * fVar85;
                        local_1258[3] = fVar119 * auVar168._12_4_ * fVar64;
                        auVar76 = blendvps(_DAT_01feb9f0,local_1248,(undefined1  [16])valid.field_0)
                        ;
                        auVar148._4_4_ = auVar76._0_4_;
                        auVar148._0_4_ = auVar76._4_4_;
                        auVar148._8_4_ = auVar76._12_4_;
                        auVar148._12_4_ = auVar76._8_4_;
                        auVar72 = minps(auVar148,auVar76);
                        auVar105._0_8_ = auVar72._8_8_;
                        auVar105._8_4_ = auVar72._0_4_;
                        auVar105._12_4_ = auVar72._4_4_;
                        auVar72 = minps(auVar105,auVar72);
                        auVar106._0_8_ =
                             CONCAT44(-(uint)(auVar72._4_4_ == auVar76._4_4_ && bVar30),
                                      -(uint)(auVar72._0_4_ == auVar76._0_4_ && bVar29));
                        auVar106._8_4_ = -(uint)(auVar72._8_4_ == auVar76._8_4_ && bVar28);
                        auVar106._12_4_ = -(uint)(auVar72._12_4_ == auVar76._12_4_ && bVar27);
                        iVar37 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar106);
                        aVar78 = valid.field_0;
                        if (iVar37 != 0) {
                          aVar78.i[2] = auVar106._8_4_;
                          aVar78._0_8_ = auVar106._0_8_;
                          aVar78.i[3] = auVar106._12_4_;
                        }
                        uVar87 = movmskps(iVar37,(undefined1  [16])aVar78);
                        lVar45 = 0;
                        if (uVar87 != 0) {
                          for (; (uVar87 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          fVar92 = local_1268[lVar45];
                          fVar139 = local_1258[lVar45];
                          uVar36 = *(undefined4 *)(local_1238 + lVar45 * 4);
                          uVar43 = *(undefined4 *)(local_1228 + lVar45 * 4);
                          uVar10 = *(undefined4 *)(local_1218 + lVar45 * 4);
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_1248 + lVar45 * 4);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar36;
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar43;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                          *(float *)(ray + k * 4 + 0xf0) = fVar92;
                          *(float *)(ray + k * 4 + 0x100) = fVar139;
                          *(uint *)(ray + k * 4 + 0x110) = uVar84;
                          *(uint *)(ray + k * 4 + 0x120) = uVar63;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_11f8 = *(undefined8 *)(mm_lookupmask_ps + lVar38);
                          uStack_11f0 = *(undefined8 *)(mm_lookupmask_ps + lVar38 + 8);
                          do {
                            uVar36 = *(undefined4 *)(ray + k * 4 + 0x80);
                            local_1018 = local_1268[lVar45];
                            local_1008 = local_1258[lVar45];
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_1248 + lVar45 * 4);
                            args.context = context->user;
                            local_1048 = *(float *)(local_1238 + lVar45 * 4);
                            uVar43 = *(undefined4 *)(local_1228 + lVar45 * 4);
                            uVar10 = *(undefined4 *)(local_1218 + lVar45 * 4);
                            local_1038._4_4_ = uVar43;
                            local_1038._0_4_ = uVar43;
                            local_1038._8_4_ = uVar43;
                            local_1038._12_4_ = uVar43;
                            local_1028._4_4_ = uVar10;
                            local_1028._0_4_ = uVar10;
                            local_1028._8_4_ = uVar10;
                            local_1028._12_4_ = uVar10;
                            fStack_1044 = local_1048;
                            uStack_1040 = local_1048;
                            uStack_103c = local_1048;
                            fStack_1014 = local_1018;
                            fStack_1010 = local_1018;
                            fStack_100c = local_1018;
                            fStack_1004 = local_1008;
                            fStack_1000 = local_1008;
                            fStack_ffc = local_1008;
                            local_ff8 = CONCAT44(uVar84,uVar84);
                            uStack_ff0 = CONCAT44(uVar84,uVar84);
                            local_fe8 = CONCAT44(uVar63,uVar63);
                            uStack_fe0 = CONCAT44(uVar63,uVar63);
                            local_fd8 = (args.context)->instID[0];
                            uStack_fd4 = local_fd8;
                            uStack_fd0 = local_fd8;
                            uStack_fcc = local_fd8;
                            local_fc8 = (args.context)->instPrimID[0];
                            uStack_fc4 = local_fc8;
                            uStack_fc0 = local_fc8;
                            uStack_fbc = local_fc8;
                            local_1348 = local_11f8;
                            uStack_1340 = uStack_11f0;
                            args.valid = (int *)&local_1348;
                            pRVar47 = (RTCIntersectArguments *)pGVar15->userPtr;
                            args.hit = (RTCHitN *)&local_1048;
                            args.N = 4;
                            pRVar40 = (RTCRayN *)pGVar15->intersectionFilterN;
                            args.geometryUserPtr = pRVar47;
                            args.ray = (RTCRayN *)ray;
                            if (pRVar40 != (RTCRayN *)0x0) {
                              pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                            }
                            auVar34._8_8_ = uStack_1340;
                            auVar34._0_8_ = local_1348;
                            if (auVar34 == (undefined1  [16])0x0) {
                              auVar110._8_4_ = 0xffffffff;
                              auVar110._0_8_ = 0xffffffffffffffff;
                              auVar110._12_4_ = 0xffffffff;
                              auVar110 = auVar110 ^ _DAT_01febe20;
                            }
                            else {
                              pRVar47 = context->args;
                              pRVar40 = (RTCRayN *)pRVar47->filter;
                              if ((pRVar40 != (RTCRayN *)0x0) &&
                                 (((pRVar47->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                                pRVar40 = (RTCRayN *)(*(code *)pRVar40)(&args);
                              }
                              auVar35._8_8_ = uStack_1340;
                              auVar35._0_8_ = local_1348;
                              auVar81._0_4_ = -(uint)((int)local_1348 == 0);
                              auVar81._4_4_ = -(uint)((int)((ulong)local_1348 >> 0x20) == 0);
                              auVar81._8_4_ = -(uint)((int)uStack_1340 == 0);
                              auVar81._12_4_ = -(uint)((int)((ulong)uStack_1340 >> 0x20) == 0);
                              auVar110 = auVar81 ^ _DAT_01febe20;
                              if (auVar35 != (undefined1  [16])0x0) {
                                auVar72 = blendvps(*(undefined1 (*) [16])args.hit,
                                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar81);
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar81);
                                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar81);
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar81);
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar81)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x100) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar81)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x110) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar81)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x120) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar81)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar72;
                                auVar72 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar81)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x140) = auVar72;
                                pRVar40 = args.ray;
                                pRVar47 = (RTCIntersectArguments *)args.hit;
                              }
                            }
                            if ((_DAT_01fecb20 & auVar110) == (undefined1  [16])0x0) {
                              *(undefined4 *)(ray + k * 4 + 0x80) = uVar36;
                            }
                            valid.field_0.v[lVar45] = 0.0;
                            fVar92 = *(float *)(ray + k * 4 + 0x80);
                            valid.field_0.i[0] =
                                 -(uint)(local_1248._0_4_ <= fVar92) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(local_1248._4_4_ <= fVar92) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(local_1248._8_4_ <= fVar92) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(local_1248._12_4_ <= fVar92) & valid.field_0.i[3];
                            iVar37 = movmskps((int)pRVar40,(undefined1  [16])valid.field_0);
                            if (iVar37 != 0) {
                              auVar76 = blendvps(_DAT_01feb9f0,local_1248,
                                                 (undefined1  [16])valid.field_0);
                              auVar150._4_4_ = auVar76._0_4_;
                              auVar150._0_4_ = auVar76._4_4_;
                              auVar150._8_4_ = auVar76._12_4_;
                              auVar150._12_4_ = auVar76._8_4_;
                              auVar72 = minps(auVar150,auVar76);
                              auVar111._0_8_ = auVar72._8_8_;
                              auVar111._8_4_ = auVar72._0_4_;
                              auVar111._12_4_ = auVar72._4_4_;
                              auVar72 = minps(auVar111,auVar72);
                              auVar112._0_8_ =
                                   CONCAT44(-(uint)(auVar72._4_4_ == auVar76._4_4_) &
                                            valid.field_0.i[1],
                                            -(uint)(auVar72._0_4_ == auVar76._0_4_) &
                                            valid.field_0.i[0]);
                              auVar112._8_4_ =
                                   -(uint)(auVar72._8_4_ == auVar76._8_4_) & valid.field_0.i[2];
                              auVar112._12_4_ =
                                   -(uint)(auVar72._12_4_ == auVar76._12_4_) & valid.field_0.i[3];
                              iVar44 = movmskps((int)pRVar47,auVar112);
                              aVar82 = valid.field_0;
                              if (iVar44 != 0) {
                                aVar82.i[2] = auVar112._8_4_;
                                aVar82._0_8_ = auVar112._0_8_;
                                aVar82.i[3] = auVar112._12_4_;
                              }
                              uVar36 = movmskps(iVar44,(undefined1  [16])aVar82);
                              uVar48 = CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar36);
                              lVar45 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                                }
                              }
                            }
                          } while ((char)iVar37 != '\0');
                        }
                      }
                    }
                  }
                }
                uVar46 = uVar46 & uVar46 - 1;
              } while (uVar46 != 0);
            }
            lVar41 = lVar41 + 1;
          } while (lVar41 != uVar50 - 8);
        }
        bi_1.field_0.i[0] = *(undefined4 *)(ray + k * 4 + 0x80);
        bi_1.field_0.i[1] = bi_1.field_0.i[0];
        bi_1.field_0.i[2] = bi_1.field_0.i[0];
        bi_1.field_0.i[3] = bi_1.field_0.i[0];
        fVar92 = local_1208;
        fVar139 = fStack_1204;
        fVar129 = fStack_1200;
        fVar171 = fStack_11fc;
        fVar85 = local_11e8;
        fVar64 = fStack_11e4;
        fVar97 = fStack_11e0;
        fVar119 = fStack_11dc;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }